

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_7zip.c
# Opt level: O0

int flush_wbuff(archive_write *a)

{
  long lVar1;
  int iVar2;
  long in_RDI;
  size_t s;
  int r;
  _7zip_conflict *zip;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  lVar1 = *(long *)(in_RDI + 0xd0);
  iVar2 = __archive_write_output
                    ((archive_write *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     (void *)(0xf000 - *(long *)(lVar1 + 0xf108)),0x1a99b9);
  if (iVar2 == 0) {
    *(undefined8 *)(lVar1 + 0xf108) = 0xf000;
  }
  return iVar2;
}

Assistant:

static int
flush_wbuff(struct archive_write *a)
{
	struct _7zip *zip;
	int r;
	size_t s;

	zip = (struct _7zip *)a->format_data;
	s = sizeof(zip->wbuff) - zip->wbuff_remaining;
	r = __archive_write_output(a, zip->wbuff, s);
	if (r != ARCHIVE_OK)
		return (r);
	zip->wbuff_remaining = sizeof(zip->wbuff);
	return (r);
}